

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void vmsa_ttbcr_raw_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  uint32_t uVar1;
  int iVar2;
  undefined8 *puVar3;
  int maskshift;
  TCR *tcr;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  puVar3 = (undefined8 *)raw_ptr(env,ri);
  uVar1 = extract32((uint32_t)value,0,3);
  iVar2 = arm_feature(env,0x1b);
  tcr = (TCR *)value;
  if (iVar2 == 0) {
    iVar2 = arm_feature(env,0x1a);
    if ((iVar2 == 0) || ((value & 0x80000000) == 0)) {
      iVar2 = arm_feature(env,0x21);
      if (iVar2 == 0) {
        tcr = (TCR *)(value & 7);
      }
      else {
        tcr = (TCR *)(value & 0x37);
      }
    }
    else {
      tcr = (TCR *)(value & 0xffffffffffc73f87);
    }
  }
  *puVar3 = tcr;
  *(uint *)(puVar3 + 1) = 0xffffffffU >> ((byte)uVar1 & 0x1f) ^ 0xffffffff;
  *(uint *)((long)puVar3 + 0xc) = 0x3fffU >> ((byte)uVar1 & 0x1f) ^ 0xffffffff;
  return;
}

Assistant:

static void vmsa_ttbcr_raw_write(CPUARMState *env, const ARMCPRegInfo *ri,
                                 uint64_t value)
{
    TCR *tcr = raw_ptr(env, ri);
    int maskshift = extract32(value, 0, 3);

    if (!arm_feature(env, ARM_FEATURE_V8)) {
        if (arm_feature(env, ARM_FEATURE_LPAE) && (value & TTBCR_EAE)) {
            /* Pre ARMv8 bits [21:19], [15:14] and [6:3] are UNK/SBZP when
             * using Long-desciptor translation table format */
            value &= ~((7 << 19) | (3 << 14) | (0xf << 3));
        } else if (arm_feature(env, ARM_FEATURE_EL3)) {
            /* In an implementation that includes the Security Extensions
             * TTBCR has additional fields PD0 [4] and PD1 [5] for
             * Short-descriptor translation table format.
             */
            value &= TTBCR_PD1 | TTBCR_PD0 | TTBCR_N;
        } else {
            value &= TTBCR_N;
        }
    }

    /* Update the masks corresponding to the TCR bank being written
     * Note that we always calculate mask and base_mask, but
     * they are only used for short-descriptor tables (ie if EAE is 0);
     * for long-descriptor tables the TCR fields are used differently
     * and the mask and base_mask values are meaningless.
     */
    tcr->raw_tcr = value;
    tcr->mask = ~(((uint32_t)0xffffffffu) >> maskshift);
    tcr->base_mask = ~((uint32_t)0x3fffu >> maskshift);
}